

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::WriteAuxFiles
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *this,
          string *namebase)

{
  long in_RDI;
  string *in_stack_00000058;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *in_stack_00000060;
  
  WriteRowObjNames(in_stack_00000060,in_stack_00000058);
  WriteRowDelNames(in_stack_00000060,in_stack_00000058);
  WriteColNames(in_stack_00000060,in_stack_00000058);
  WriteUnusedVarNames(in_stack_00000060,in_stack_00000058);
  WriteFixedVars(in_stack_00000060,in_stack_00000058);
  *(int *)(in_RDI + 0x9c) =
       *(int *)(in_RDI + 0x124) + *(int *)(in_RDI + 0x128) + *(int *)(in_RDI + 300);
  WriteObjAdj(in_stack_00000060,in_stack_00000058);
  return;
}

Assistant:

void NLWriter2<Params>::WriteAuxFiles(
    const std::string& namebase) {
  WriteRowObjNames(namebase);
  WriteRowDelNames(namebase);
  WriteColNames(namebase);
  WriteUnusedVarNames(namebase);
  WriteFixedVars(namebase);
  header_.max_var_name_len =     // maxLen_FixName_ can be longer
      maxLen_ColName_ + maxLen_UnvName_ + maxLen_FixName_;
  WriteObjAdj(namebase);
}